

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O3

string * __thiscall
stackjit::toString_abi_cxx11_
          (string *__return_storage_ptr__,stackjit *this,AccessModifier *accessModifier)

{
  stackjit sVar1;
  char *pcVar2;
  char *pcVar3;
  
  sVar1 = *this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (sVar1 == (stackjit)0x1) {
    pcVar3 = "public";
    pcVar2 = "";
  }
  else if (sVar1 == (stackjit)0x0) {
    pcVar3 = "private";
    pcVar2 = "";
  }
  else {
    pcVar2 = "";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const AccessModifier& accessModifier) {
		switch (accessModifier) {
			case AccessModifier::Private:
				return "private";
			case AccessModifier::Public:
				return "public";
			default:
				return "";
		}
	}